

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

void __thiscall xmrig::Api::Api(Api *this,Base *base)

{
  uint64_t uVar1;
  Config *pCVar2;
  
  (this->super_IBaseListener)._vptr_IBaseListener = (_func_int **)&PTR__Api_001bb820;
  this->m_base = base;
  memset(this->m_id,0,0xa0);
  uVar1 = Chrono::currentMSecsSinceEpoch();
  this->m_timestamp = uVar1;
  this->m_httpd = (Httpd *)0x0;
  (this->m_listeners).
  super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_listeners).
  super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_listeners).
  super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Base::addListener(base,&this->super_IBaseListener);
  pCVar2 = Base::config(base);
  genId(this,&(pCVar2->super_BaseConfig).m_apiId);
  return;
}

Assistant:

xmrig::Api::Api(Base *base) :
    m_base(base),
    m_id(),
    m_workerId(),
    m_timestamp(Chrono::currentMSecsSinceEpoch()),
    m_httpd(nullptr)
{
    base->addListener(this);

    genId(base->config()->apiId());
}